

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_t * ptls_new(ptls_context_t *ctx,int is_server)

{
  st_ptls_update_open_count_t *psVar1;
  ptls_t *ppVar2;
  
  if (ctx->get_time != (ptls_get_time_t *)0x0) {
    ppVar2 = (ptls_t *)malloc(0x218);
    if (ppVar2 != (ptls_t *)0x0) {
      psVar1 = ctx->update_open_count;
      if (psVar1 != (st_ptls_update_open_count_t *)0x0) {
        (*psVar1->cb)(psVar1,1);
      }
      memset(&ppVar2->state,0,0x210);
      ppVar2->ctx = ctx;
      ppVar2->field_0x160 = ctx->field_0x68 & 4 | ppVar2->field_0x160 & 0xfa | (byte)is_server & 1;
      if (is_server == 0) {
        (*ctx->random_bytes)(ppVar2->client_random,0x20);
        (*ppVar2->ctx->random_bytes)(&ppVar2->field_20,0x20);
      }
      else {
        ppVar2->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
        (ppVar2->field_20).server.early_data_skipped_bytes = 0xffffffff;
      }
    }
    return ppVar2;
  }
  __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                ,"/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                ,0x1039,"ptls_t *ptls_new(ptls_context_t *, int)");
}

Assistant:

ptls_t *ptls_new(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;
    if (!is_server) {
        tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
        tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
        tls->ctx->random_bytes(tls->client.legacy_session_id, sizeof(tls->client.legacy_session_id));
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
        tls->server.early_data_skipped_bytes = UINT32_MAX;
    }

    return tls;
}